

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo.cpp
# Opt level: O2

void __thiscall QStorageInfo::QStorageInfo(QStorageInfo *this,QString *path)

{
  QStorageInfoPrivate *pQVar1;
  
  pQVar1 = (QStorageInfoPrivate *)operator_new(0xa0);
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)0x0;
  (pQVar1->rootPath).d.d = (Data *)0x0;
  (pQVar1->rootPath).d.ptr = (char16_t *)0x0;
  *(undefined1 (*) [16])&(pQVar1->rootPath).d.size = (undefined1  [16])0x0;
  (pQVar1->device).d.ptr = (char *)0x0;
  (pQVar1->device).d.size = 0;
  (pQVar1->subvolume).d.d = (Data *)0x0;
  (pQVar1->subvolume).d.ptr = (char *)0x0;
  *(undefined1 (*) [16])&(pQVar1->subvolume).d.size = (undefined1  [16])0x0;
  (pQVar1->fileSystemType).d.ptr = (char *)0x0;
  (pQVar1->fileSystemType).d.size = 0;
  (pQVar1->name).d.size = 0;
  (pQVar1->name).d.d = (Data *)0x0;
  (pQVar1->name).d.ptr = (char16_t *)0x0;
  *(undefined4 *)&pQVar1->bytesTotal = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesTotal + 4) = 0xffffffff;
  *(undefined4 *)&pQVar1->bytesFree = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesFree + 4) = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesFree + 4) = 0xffffffff;
  *(undefined4 *)&pQVar1->bytesAvailable = 0xffffffff;
  *(undefined4 *)((long)&pQVar1->bytesAvailable + 4) = 0xffffffff;
  pQVar1->blockSize = -1;
  pQVar1->readOnly = false;
  pQVar1->ready = false;
  pQVar1->valid = false;
  (this->d).d.ptr = pQVar1;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
       = (Type)((int)(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  setPath(this,path);
  return;
}

Assistant:

QStorageInfo::QStorageInfo(const QString &path)
    : d(new QStorageInfoPrivate)
{
    setPath(path);
}